

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMatrix3x3.h
# Opt level: O2

cbtMatrix3x3 * __thiscall cbtMatrix3x3::transposeTimes(cbtMatrix3x3 *this,cbtMatrix3x3 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  cbtMatrix3x3 *in_RDI;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  
  fVar1 = this->m_el[1].m_floats[0];
  fVar2 = this->m_el[1].m_floats[1];
  fVar3 = this->m_el[1].m_floats[2];
  fVar4 = m->m_el[1].m_floats[2];
  cVar5 = this->m_el[0].m_floats[0];
  auVar14._4_4_ = cVar5;
  auVar14._0_4_ = cVar5;
  auVar14._8_4_ = cVar5;
  auVar14._12_4_ = cVar5;
  cVar5 = this->m_el[0].m_floats[1];
  auVar18._4_4_ = cVar5;
  auVar18._0_4_ = cVar5;
  auVar18._8_4_ = cVar5;
  auVar18._12_4_ = cVar5;
  cVar5 = this->m_el[0].m_floats[2];
  auVar20._4_4_ = cVar5;
  auVar20._0_4_ = cVar5;
  auVar20._8_4_ = cVar5;
  auVar20._12_4_ = cVar5;
  cVar5 = m->m_el[0].m_floats[2];
  uVar8 = *(undefined8 *)m->m_el[1].m_floats;
  cVar6 = this->m_el[2].m_floats[0];
  auVar16._4_4_ = cVar6;
  auVar16._0_4_ = cVar6;
  auVar16._8_4_ = cVar6;
  auVar16._12_4_ = cVar6;
  cVar6 = m->m_el[2].m_floats[2];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)m->m_el[2].m_floats;
  cVar7 = this->m_el[2].m_floats[1];
  auVar19._4_4_ = cVar7;
  auVar19._0_4_ = cVar7;
  auVar19._8_4_ = cVar7;
  auVar19._12_4_ = cVar7;
  cVar7 = this->m_el[2].m_floats[2];
  auVar21._4_4_ = cVar7;
  auVar21._0_4_ = cVar7;
  auVar21._8_4_ = cVar7;
  auVar21._12_4_ = cVar7;
  fVar23 = (float)uVar8;
  auVar13._0_4_ = fVar23 * fVar1;
  fVar24 = (float)((ulong)uVar8 >> 0x20);
  auVar13._4_4_ = fVar24 * fVar1;
  auVar13._8_4_ = fVar1 * 0.0;
  auVar13._12_4_ = fVar1 * 0.0;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar4)),auVar14,ZEXT416((uint)cVar5));
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar2)),auVar18,ZEXT416((uint)cVar5));
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar4)),auVar20,ZEXT416((uint)cVar5));
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)m->m_el[0].m_floats;
  auVar10 = vfmadd231ss_fma(auVar15,auVar16,ZEXT416((uint)cVar6));
  auVar11 = vfmadd231ss_fma(auVar17,auVar19,ZEXT416((uint)cVar6));
  auVar9 = vfmadd231ss_fma(auVar9,auVar21,ZEXT416((uint)cVar6));
  auVar15 = vfmadd231ps_fma(auVar13,auVar12,auVar14);
  auVar15 = vfmadd231ps_fma(auVar15,auVar22,auVar16);
  auVar17._0_4_ = fVar23 * fVar2;
  auVar17._4_4_ = fVar24 * fVar2;
  auVar17._8_4_ = fVar2 * 0.0;
  auVar17._12_4_ = fVar2 * 0.0;
  auVar17 = vfmadd231ps_fma(auVar17,auVar12,auVar18);
  uVar8 = vmovlps_avx(auVar15);
  *(undefined8 *)in_RDI->m_el[0].m_floats = uVar8;
  in_RDI->m_el[0].m_floats[2] = auVar10._0_4_;
  auVar15._0_4_ = fVar23 * fVar3;
  auVar15._4_4_ = fVar24 * fVar3;
  auVar15._8_4_ = fVar3 * 0.0;
  auVar15._12_4_ = fVar3 * 0.0;
  in_RDI->m_el[0].m_floats[3] = 0.0;
  auVar15 = vfmadd231ps_fma(auVar15,auVar20,auVar12);
  auVar17 = vfmadd231ps_fma(auVar17,auVar22,auVar19);
  auVar15 = vfmadd231ps_fma(auVar15,auVar21,auVar22);
  uVar8 = vmovlps_avx(auVar17);
  *(undefined8 *)in_RDI->m_el[1].m_floats = uVar8;
  in_RDI->m_el[1].m_floats[2] = auVar11._0_4_;
  in_RDI->m_el[1].m_floats[3] = 0.0;
  uVar8 = vmovlps_avx(auVar15);
  *(undefined8 *)in_RDI->m_el[2].m_floats = uVar8;
  in_RDI->m_el[2].m_floats[2] = auVar9._0_4_;
  in_RDI->m_el[2].m_floats[3] = 0.0;
  return in_RDI;
}

Assistant:

SIMD_FORCE_INLINE cbtMatrix3x3
cbtMatrix3x3::transposeTimes(const cbtMatrix3x3& m) const
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE))
	// zeros w
	//    static const __m128i xyzMask = (const __m128i){ -1ULL, 0xffffffffULL };
	__m128 row = m_el[0].mVec128;
	__m128 m0 = _mm_and_ps(m.getRow(0).mVec128, btvFFF0fMask);
	__m128 m1 = _mm_and_ps(m.getRow(1).mVec128, btvFFF0fMask);
	__m128 m2 = _mm_and_ps(m.getRow(2).mVec128, btvFFF0fMask);
	__m128 r0 = _mm_mul_ps(m0, _mm_shuffle_ps(row, row, 0));
	__m128 r1 = _mm_mul_ps(m0, _mm_shuffle_ps(row, row, 0x55));
	__m128 r2 = _mm_mul_ps(m0, _mm_shuffle_ps(row, row, 0xaa));
	row = m_el[1].mVec128;
	r0 = _mm_add_ps(r0, _mm_mul_ps(m1, _mm_shuffle_ps(row, row, 0)));
	r1 = _mm_add_ps(r1, _mm_mul_ps(m1, _mm_shuffle_ps(row, row, 0x55)));
	r2 = _mm_add_ps(r2, _mm_mul_ps(m1, _mm_shuffle_ps(row, row, 0xaa)));
	row = m_el[2].mVec128;
	r0 = _mm_add_ps(r0, _mm_mul_ps(m2, _mm_shuffle_ps(row, row, 0)));
	r1 = _mm_add_ps(r1, _mm_mul_ps(m2, _mm_shuffle_ps(row, row, 0x55)));
	r2 = _mm_add_ps(r2, _mm_mul_ps(m2, _mm_shuffle_ps(row, row, 0xaa)));
	return cbtMatrix3x3(r0, r1, r2);

#elif defined BT_USE_NEON
	// zeros w
	static const uint32x4_t xyzMask = (const uint32x4_t){static_cast<uint32_t>(-1), static_cast<uint32_t>(-1), static_cast<uint32_t>(-1), 0};
	float32x4_t m0 = (float32x4_t)vandq_u32((uint32x4_t)m.getRow(0).mVec128, xyzMask);
	float32x4_t m1 = (float32x4_t)vandq_u32((uint32x4_t)m.getRow(1).mVec128, xyzMask);
	float32x4_t m2 = (float32x4_t)vandq_u32((uint32x4_t)m.getRow(2).mVec128, xyzMask);
	float32x4_t row = m_el[0].mVec128;
	float32x4_t r0 = vmulq_lane_f32(m0, vget_low_f32(row), 0);
	float32x4_t r1 = vmulq_lane_f32(m0, vget_low_f32(row), 1);
	float32x4_t r2 = vmulq_lane_f32(m0, vget_high_f32(row), 0);
	row = m_el[1].mVec128;
	r0 = vmlaq_lane_f32(r0, m1, vget_low_f32(row), 0);
	r1 = vmlaq_lane_f32(r1, m1, vget_low_f32(row), 1);
	r2 = vmlaq_lane_f32(r2, m1, vget_high_f32(row), 0);
	row = m_el[2].mVec128;
	r0 = vmlaq_lane_f32(r0, m2, vget_low_f32(row), 0);
	r1 = vmlaq_lane_f32(r1, m2, vget_low_f32(row), 1);
	r2 = vmlaq_lane_f32(r2, m2, vget_high_f32(row), 0);
	return cbtMatrix3x3(r0, r1, r2);
#else
	return cbtMatrix3x3(
		m_el[0].x() * m[0].x() + m_el[1].x() * m[1].x() + m_el[2].x() * m[2].x(),
		m_el[0].x() * m[0].y() + m_el[1].x() * m[1].y() + m_el[2].x() * m[2].y(),
		m_el[0].x() * m[0].z() + m_el[1].x() * m[1].z() + m_el[2].x() * m[2].z(),
		m_el[0].y() * m[0].x() + m_el[1].y() * m[1].x() + m_el[2].y() * m[2].x(),
		m_el[0].y() * m[0].y() + m_el[1].y() * m[1].y() + m_el[2].y() * m[2].y(),
		m_el[0].y() * m[0].z() + m_el[1].y() * m[1].z() + m_el[2].y() * m[2].z(),
		m_el[0].z() * m[0].x() + m_el[1].z() * m[1].x() + m_el[2].z() * m[2].x(),
		m_el[0].z() * m[0].y() + m_el[1].z() * m[1].y() + m_el[2].z() * m[2].y(),
		m_el[0].z() * m[0].z() + m_el[1].z() * m[1].z() + m_el[2].z() * m[2].z());
#endif
}